

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeDependencies.cpp
# Opt level: O0

bool helics::iteratingWaitingDependencyCheck(DependencyInfo *dep)

{
  DependencyInfo *dep_local;
  bool local_1;
  
  if ((dep->dependency & 1U) == 0) {
    local_1 = true;
  }
  else if (dep->connection == SELF) {
    local_1 = true;
  }
  else if (((dep->super_TimeData).mTimeState == initialized) &&
          ((dep->super_TimeData).grantedIteration == 0)) {
    local_1 = false;
  }
  else if ((((dep->super_TimeData).mTimeState == exec_requested_iterative) ||
           ((dep->super_TimeData).mTimeState == exec_requested_require_iteration)) &&
          ((dep->super_TimeData).sequenceCounter < (dep->super_TimeData).grantedIteration)) {
    local_1 = false;
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

static bool iteratingWaitingDependencyCheck(const DependencyInfo& dep)
{
    if (!dep.dependency) {
        return true;
    }
    if (dep.connection == ConnectionType::SELF) {
        return true;
    }
    if (dep.mTimeState == TimeState::initialized) {
        if (dep.grantedIteration == 0) {
            return false;
        }
    }
    if (dep.mTimeState == TimeState::exec_requested_iterative ||
        dep.mTimeState == TimeState::exec_requested_require_iteration) {
        if (dep.sequenceCounter < dep.grantedIteration) {
            return false;
        }
    }
    return true;
}